

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

void __thiscall
Diligent::RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *this,
          RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *AutoPtr)

{
  RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *AutoPtr_local;
  RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *this_local;
  
  this->m_pObject = AutoPtr->m_pObject;
  if (this->m_pObject != (BottomLevelASVkImpl *)0x0) {
    RefCountedObject<Diligent::IBottomLevelASVk>::AddRef
              ((RefCountedObject<Diligent::IBottomLevelASVk> *)this->m_pObject);
  }
  return;
}

Assistant:

RefCntAutoPtr(const RefCntAutoPtr& AutoPtr) noexcept :
        m_pObject{AutoPtr.m_pObject}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }